

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

size_t printDecoratedArg(OPTYPE *pMyOperand,PDISASM pMyDisasm,size_t i)

{
  UInt32 UVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_20;
  size_t i_local;
  PDISASM pMyDisasm_local;
  OPTYPE *pMyOperand_local;
  
  sVar2 = printOneSpace(pMyDisasm,i);
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x200) {
    strcpy(pMyDisasm->CompleteInstr + sVar2,NasmPrefixes[(pMyDisasm->Reserved_).MemDecoration + -1])
    ;
    local_20 = strlen(pMyDisasm->CompleteInstr);
    if ((((pMyDisasm->Reserved_).SEGMENTREGS == 0) && ((pMyDisasm->Reserved_).SEGMENTFS == 0)) &&
       ((pMyDisasm->Prefix).GSPrefix != '\x01')) {
      strcpy(pMyDisasm->CompleteInstr + local_20,"[");
      local_20 = local_20 + 1;
    }
    else {
      strcpy(pMyDisasm->CompleteInstr + local_20,"[");
      UVar1 = find_exp(pMyOperand->SegmentReg);
      strcpy(pMyDisasm->CompleteInstr + local_20 + 1,SegmentRegs[UVar1]);
      local_20 = strlen(pMyDisasm->CompleteInstr);
    }
  }
  else {
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0) {
      strcpy(pMyDisasm->CompleteInstr + sVar2,
             MasmPrefixes[(pMyDisasm->Reserved_).MemDecoration + -1]);
      local_20 = strlen(pMyDisasm->CompleteInstr);
    }
    else if ((pMyDisasm->Reserved_).SYNTAX_ == 0x800) {
      strcpy(pMyDisasm->CompleteInstr + sVar2,
             IntrinsicPrefixes[(pMyDisasm->Reserved_).MemDecoration + -1]);
      local_20 = strlen(pMyDisasm->CompleteInstr);
    }
    else {
      strcpy(pMyDisasm->CompleteInstr + sVar2,
             GoAsmPrefixes[(pMyDisasm->Reserved_).MemDecoration + -1]);
      local_20 = strlen(pMyDisasm->CompleteInstr);
    }
    if ((((pMyDisasm->Reserved_).SEGMENTREGS == 0) && ((pMyDisasm->Reserved_).SEGMENTFS == 0)) &&
       ((pMyDisasm->Prefix).GSPrefix != '\x01')) {
      strcpy(pMyDisasm->CompleteInstr + local_20,"[");
    }
    else {
      UVar1 = find_exp(pMyOperand->SegmentReg);
      strcpy(pMyDisasm->CompleteInstr + local_20,SegmentRegs[UVar1]);
      local_20 = strlen(pMyDisasm->CompleteInstr);
      strcpy(pMyDisasm->CompleteInstr + local_20,"[");
    }
    local_20 = local_20 + 1;
  }
  strcpy(pMyDisasm->CompleteInstr + local_20,pMyOperand->OpMnemonic);
  sVar3 = strlen(pMyDisasm->CompleteInstr);
  strcpy(pMyDisasm->CompleteInstr + sVar3,"]");
  return sVar3 + 1;
}

Assistant:

size_t __bea_callspec__ printDecoratedArg(OPTYPE* pMyOperand, PDISASM pMyDisasm, size_t i)
{
  i = printOneSpace(pMyDisasm, i);
  if (GV.SYNTAX_ == NasmSyntax) {
    (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, NasmPrefixes[GV.MemDecoration-1]);
    i = strlen((char*) &pMyDisasm->CompleteInstr);
    if ((GV.SEGMENTREGS != 0) || (GV.SEGMENTFS != 0) || (pMyDisasm->Prefix.GSPrefix == InUsePrefix)){
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "[");
      i++;
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, SegmentRegs[find_exp(pMyOperand->SegmentReg)]);
      i = strlen((char*) &pMyDisasm->CompleteInstr);
    }
    else {
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "[");
      i++;
    }
  }
  else {
    if (GV.SYNTAX_ == MasmSyntax) {
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, MasmPrefixes[GV.MemDecoration-1]);
      i = strlen((char*) &pMyDisasm->CompleteInstr);
    }
    else if (GV.SYNTAX_ == IntrinsicMemSyntax) {
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, IntrinsicPrefixes[GV.MemDecoration-1]);
      i = strlen((char*) &pMyDisasm->CompleteInstr);
    }
    else {
        (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, GoAsmPrefixes[GV.MemDecoration-1]);
        i = strlen((char*) &pMyDisasm->CompleteInstr);
    }
    if ((GV.SEGMENTREGS != 0) || (GV.SEGMENTFS != 0) || (pMyDisasm->Prefix.GSPrefix == InUsePrefix)){
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, SegmentRegs[find_exp(pMyOperand->SegmentReg)]);
      i = strlen((char*) &pMyDisasm->CompleteInstr);
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "[");
      i++;
    }
    else {
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "[");
      i++;
    }
  }
  (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, (char*) &pMyOperand->OpMnemonic);
  i = strlen((char*) &pMyDisasm->CompleteInstr);
  (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "]");
  i++;
  return i;
}